

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::showEvent(QMdiSubWindow *this,QShowEvent *showEvent)

{
  bool bVar1;
  QMdiSubWindowPrivate *this_00;
  QObject *pQVar2;
  QMenuBar *menuBar_00;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QSize *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  QMdiSubWindowPrivate *in_stack_00000010;
  QMenuBar *menuBar;
  QMdiSubWindowPrivate *d;
  QWidget *in_stack_ffffffffffffff98;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffa0;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffa8;
  bool visible;
  undefined4 in_stack_ffffffffffffffb0;
  Corner in_stack_ffffffffffffffb4;
  QSizeGrip *in_stack_ffffffffffffffc0;
  QMdiSubWindowPrivate *pQVar5;
  QSizeGrip *in_stack_ffffffffffffffe0;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffe8;
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QMdiSubWindow *)0x634f6f);
  pQVar2 = QObject::parent((QObject *)0x634f7e);
  if (pQVar2 == (QObject *)0x0) {
    QWidget::showEvent(in_RDI,(QShowEvent *)in_RSI);
  }
  else {
    QWidget::style(in_stack_ffffffffffffff98);
    bVar1 = isMacStyle((QStyle *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
    if (bVar1) {
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QSizeGrip> *)0x634fca);
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
      if (!bVar1) {
        QWidget::windowFlags((QWidget *)in_stack_ffffffffffffffa0);
        local_c.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QFlags<Qt::WindowType>::operator&
                       ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffffa0,
                        (WindowType)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        bVar1 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_c);
        in_stack_ffffffffffffffb4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
      }
    }
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) != '\0') {
      pQVar5 = this_00;
      in_stack_ffffffffffffffa8 = (QMdiSubWindowPrivate *)operator_new(0x28);
      QSizeGrip::QSizeGrip(in_stack_ffffffffffffffc0,in_RDI);
      QMdiSubWindowPrivate::setSizeGrip(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      bVar1 = QWidget::isMinimized(in_RDI);
      visible = SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0);
      if (bVar1) {
        QMdiSubWindowPrivate::setSizeGripVisible
                  ((QMdiSubWindowPrivate *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),visible);
        in_stack_ffffffffffffffa0 = this_00;
        this_00 = pQVar5;
      }
      else {
        QMdiSubWindowPrivate::setSizeGripVisible
                  ((QMdiSubWindowPrivate *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),visible);
        in_stack_ffffffffffffffa0 = this_00;
        this_00 = pQVar5;
      }
      QWidget::size(in_stack_ffffffffffffff98);
      QSize::expandedTo((QSize *)in_stack_ffffffffffffffa8,(QSize *)in_stack_ffffffffffffffa0);
      QWidget::resize(pQVar3,in_RSI);
    }
    QMdiSubWindowPrivate::updateDirtyRegions(in_stack_ffffffffffffffa0);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdi::ControlContainer> *)0x6350c9);
    if ((bVar1) &&
       (menuBar_00 = QMdiSubWindowPrivate::menuBar(in_stack_ffffffffffffffa8),
       menuBar_00 != (QMenuBar *)0x0)) {
      pQVar3 = QMenuBar::cornerWidget((QMenuBar *)in_RDI,in_stack_ffffffffffffffb4);
      pQVar4 = maximizedButtonsWidget((QMdiSubWindow *)in_stack_ffffffffffffffa8);
      if (pQVar3 != pQVar4) {
        QMdiSubWindowPrivate::showButtonsInMenuBar(this_00,menuBar_00);
      }
    }
    QMdiSubWindowPrivate::setActive(in_stack_00000010,in_stack_0000000f,in_stack_0000000e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiSubWindow);
    if (!parent()) {
        QWidget::showEvent(showEvent);
        return;
    }

#if QT_CONFIG(sizegrip)
    if (isMacStyle(style()) && !d->sizeGrip
            && !(windowFlags() & Qt::FramelessWindowHint)) {
        d->setSizeGrip(new QSizeGrip(this));
        Q_ASSERT(d->sizeGrip);
        if (isMinimized())
            d->setSizeGripVisible(false);
        else
            d->setSizeGripVisible(true);
        resize(size().expandedTo(d->internalMinimumSize));
    }
#endif

    d->updateDirtyRegions();
    // Show buttons in the menu bar if they're already not there.
    // We want to do this when QMdiSubWindow becomes visible after being hidden.
#if QT_CONFIG(menubar)
    if (d->controlContainer) {
        if (QMenuBar *menuBar = d->menuBar()) {
            if (menuBar->cornerWidget(Qt::TopRightCorner) != maximizedButtonsWidget())
                d->showButtonsInMenuBar(menuBar);
        }
    }
#endif
    d->setActive(true);
}